

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O1

CURLcode pop3_statemachine(Curl_easy *data,connectdata *conn)

{
  uchar *puVar1;
  ushort *puVar2;
  dynbuf *s;
  IMAP *pIVar3;
  byte bVar4;
  uint uVar5;
  _Bool _Var6;
  unsigned_short uVar7;
  CURLcode CVar8;
  char *src;
  void *pvVar9;
  int *piVar10;
  char *pcVar11;
  size_t sVar12;
  size_t __n;
  connectdata *pcVar13;
  ulong uVar14;
  ulong maxlen;
  byte *pbVar15;
  byte *pbVar16;
  pingpong *pp;
  long lVar17;
  bool bVar18;
  int pop3code;
  size_t nread;
  saslprogress local_58;
  undefined4 uStack_54;
  uint local_4c;
  connectdata *local_48;
  pingpong *local_40;
  size_t local_38;
  
  local_38 = 0;
  if ((conn->proto).pop3c.state == POP3_UPGRADETLS) {
    CVar8 = pop3_perform_upgrade_tls(data,conn);
    return CVar8;
  }
  pp = (pingpong *)&conn->proto;
  local_40 = pp;
  if ((conn->proto).ftpc.pp.sendleft != 0) {
    CVar8 = Curl_pp_flushsend(data,pp);
    return CVar8;
  }
  do {
    CVar8 = Curl_pp_readresp(data,0,pp,(int *)&local_4c,&local_38);
    uVar5 = local_4c;
    if (CVar8 != CURLE_OK) {
      return CVar8;
    }
    if (local_4c == 0) {
      return CURLE_OK;
    }
    switch((conn->proto).pop3c.state) {
    case POP3_SERVERGREET:
      pcVar13 = data->conn;
      pcVar11 = Curl_dyn_ptr(&(pcVar13->proto).ftpc.pp.recvbuf);
      if (uVar5 == 0x2b) {
        uVar14 = (data->conn->proto).ftpc.pp.nfinal;
        CVar8 = CURLE_OK;
        if (3 < uVar14) {
          src = (char *)memchr(pcVar11,0x3c,uVar14);
          if (src == (char *)0x0) {
            pvVar9 = (void *)0x0;
          }
          else {
            pvVar9 = memchr(src,0x3e,(size_t)(pcVar11 + (uVar14 - (long)src)));
          }
          if (pvVar9 != (void *)0x0) {
            __n = (long)pvVar9 + (1 - (long)src);
            pvVar9 = memchr(src,0x40,__n);
            if (pvVar9 != (void *)0x0) {
              pvVar9 = Curl_memdup0(src,__n);
              (pcVar13->proto).imapc.dyn.toobig = (size_t)pvVar9;
              if (pvVar9 == (void *)0x0) {
                CVar8 = CURLE_OUT_OF_MEMORY;
                break;
              }
              puVar1 = &(pcVar13->proto).pop3c.authtypes;
              *puVar1 = *puVar1 | 2;
            }
          }
          CVar8 = pop3_perform_capa(data,pcVar13);
        }
      }
      else {
        Curl_failf(data,"Got unexpected pop3-server response");
LAB_0014b866:
        CVar8 = CURLE_WEIRD_SERVER_REPLY;
      }
      break;
    case POP3_CAPA:
      pcVar13 = data->conn;
      piVar10 = (int *)Curl_dyn_ptr(&(pcVar13->proto).ftpc.pp.recvbuf);
      if (uVar5 != 0x2b) {
        if (uVar5 == 0x2a) {
          uVar14 = (data->conn->proto).ftpc.pp.nfinal;
          if (uVar14 < 4) {
LAB_0014b5f1:
            if ((4 < uVar14) && ((char)piVar10[1] == ' ' && *piVar10 == 0x4c534153)) {
              puVar1 = &(pcVar13->proto).pop3c.authtypes;
              *puVar1 = *puVar1 | 4;
              lVar17 = uVar14 - 5;
              pbVar15 = (byte *)((long)piVar10 + 5);
              local_48 = pcVar13;
LAB_0014b62d:
              bVar18 = lVar17 == 0;
              pbVar16 = pbVar15;
              if (!bVar18) {
                pbVar16 = pbVar15 + lVar17;
                lVar17 = -lVar17;
                bVar18 = false;
                do {
                  if ((0x20 < (ulong)*pbVar15) ||
                     ((0x100002600U >> ((ulong)*pbVar15 & 0x3f) & 1) == 0)) {
                    uVar14 = 0;
                    goto LAB_0014b681;
                  }
                  pbVar15 = pbVar15 + 1;
                  lVar17 = lVar17 + 1;
                  bVar18 = lVar17 == 0;
                } while (!bVar18);
              }
              lVar17 = 0;
              goto LAB_0014b66d;
            }
          }
          else if (*piVar10 == 0x534c5453) {
            pbVar15 = (byte *)((long)&pcVar13->proto + 0xe2);
            *pbVar15 = *pbVar15 | 2;
          }
          else {
            if (*piVar10 != 0x52455355) goto LAB_0014b5f1;
            puVar1 = &(pcVar13->proto).pop3c.authtypes;
            *puVar1 = *puVar1 | 1;
          }
LAB_0014ba85:
          CVar8 = CURLE_OK;
          break;
        }
        puVar1 = &(pcVar13->proto).pop3c.authtypes;
        *puVar1 = *puVar1 | 1;
      }
      if (((data->set).use_ssl == '\0') || (_Var6 = Curl_conn_is_ssl(pcVar13,0), _Var6)) {
LAB_0014b8b8:
        CVar8 = pop3_perform_authentication(data,pcVar13);
      }
      else if ((uVar5 == 0x2b) && ((*(byte *)((long)&pcVar13->proto + 0xe2) & 2) != 0)) {
        CVar8 = Curl_pp_sendf(data,&(pcVar13->proto).ftpc.pp,"%s","STLS");
        if (CVar8 == CURLE_OK) {
          (data->conn->proto).pop3c.state = POP3_STARTTLS;
        }
      }
      else {
        if ((data->set).use_ssl < 2) goto LAB_0014b8b8;
        pcVar11 = "STLS not supported.";
LAB_0014ba21:
        Curl_failf(data,pcVar11);
        CVar8 = CURLE_USE_SSL_FAILED;
      }
      break;
    case POP3_STARTTLS:
      CVar8 = CURLE_WEIRD_SERVER_REPLY;
      if ((data->conn->proto).ftpc.pp.overflow == 0) {
        if (local_4c != 0x2b) {
          pcVar13 = conn;
          if ((data->set).use_ssl != '\x01') {
            pcVar11 = "STARTTLS denied";
            goto LAB_0014ba21;
          }
          goto LAB_0014b8b8;
        }
        CVar8 = pop3_perform_upgrade_tls(data,conn);
      }
      break;
    default:
      goto switchD_0014b523_caseD_4;
    case POP3_AUTH:
      pcVar13 = data->conn;
      CVar8 = Curl_sasl_continue((SASL *)&(pcVar13->proto).imapc.sasl.authmechs,data,local_4c,
                                 &local_58);
      if (CVar8 == CURLE_OK) {
        if (local_58 == SASL_IDLE) {
          bVar4 = (pcVar13->proto).pop3c.preftype & (pcVar13->proto).pop3c.authtypes;
          if ((bVar4 & 2) == 0) {
            if ((bVar4 & 1) == 0) {
              Curl_failf(data,"Authentication cancelled");
              goto LAB_0014b751;
            }
            CVar8 = pop3_perform_user(data,pcVar13);
          }
          else {
            CVar8 = pop3_perform_apop(data,pcVar13);
          }
        }
        else {
          CVar8 = CURLE_OK;
          if (local_58 == SASL_DONE) {
            (data->conn->proto).pop3c.state = POP3_STOP;
          }
        }
      }
      break;
    case POP3_APOP:
      if (local_4c == 0x2b) goto switchD_0014b523_caseD_4;
      pcVar11 = "Authentication failed: %d";
LAB_0014b747:
      Curl_failf(data,pcVar11,(ulong)local_4c);
LAB_0014b751:
      CVar8 = CURLE_LOGIN_DENIED;
      break;
    case POP3_USER:
      if (local_4c == 0x2b) {
        pcVar11 = data->conn->passwd;
        if (pcVar11 == (char *)0x0) {
          pcVar11 = "";
        }
        CVar8 = Curl_pp_sendf(data,&(data->conn->proto).ftpc.pp,"PASS %s",pcVar11);
      }
      else {
        Curl_failf(data,"Access denied. %c",(ulong)local_4c);
        CVar8 = CURLE_LOGIN_DENIED;
      }
      if (CVar8 == CURLE_OK) {
        (data->conn->proto).pop3c.state = POP3_PASS;
      }
      break;
    case POP3_PASS:
      if (local_4c != 0x2b) {
        pcVar11 = "Access denied. %c";
        goto LAB_0014b747;
      }
      goto switchD_0014b523_caseD_4;
    case POP3_COMMAND:
      pcVar13 = data->conn;
      if (local_4c != 0x2b) {
        (pcVar13->proto).pop3c.state = POP3_STOP;
        goto LAB_0014b866;
      }
      pIVar3 = (data->req).p.imap;
      (pcVar13->proto).pop3c.eob = 2;
      (pcVar13->proto).pop3c.strip = 2;
      if (pIVar3->transfer == PPTRANSFER_BODY) {
        Curl_xfer_setup1(data,1,-1,false);
        sVar12 = (pcVar13->proto).ftpc.pp.overflow;
        if (sVar12 == 0) goto switchD_0014b523_caseD_4;
        s = &(pcVar13->proto).ftpc.pp.recvbuf;
        Curl_dyn_tail(s,sVar12);
        (pcVar13->proto).ftpc.pp.nfinal = 0;
        if (((data->req).field_0xdb & 2) == 0) {
          pcVar11 = Curl_dyn_ptr(s);
          sVar12 = Curl_dyn_len(s);
          CVar8 = pop3_write(data,pcVar11,sVar12,false);
          if (CVar8 != CURLE_OK) break;
        }
        Curl_dyn_reset(s);
      }
      (pcVar13->proto).ftpc.pp.overflow = 0;
switchD_0014b523_caseD_4:
      (data->conn->proto).pop3c.state = POP3_STOP;
      CVar8 = CURLE_OK;
    }
    pp = local_40;
    if (CVar8 != CURLE_OK) {
      return CVar8;
    }
    if ((conn->proto).pop3c.state == POP3_STOP) {
      return CURLE_OK;
    }
    _Var6 = Curl_pp_moredata(local_40);
    if (!_Var6) {
      return CURLE_OK;
    }
  } while( true );
  while (uVar14 = uVar14 + 1, maxlen = -lVar17, uVar14 < (ulong)-lVar17) {
LAB_0014b681:
    if (((ulong)pbVar15[uVar14] < 0x21) &&
       (maxlen = uVar14, (0x100002600U >> ((ulong)pbVar15[uVar14] & 0x3f) & 1) != 0)) break;
  }
  uVar7 = Curl_sasl_decode_mech((char *)pbVar15,maxlen,(size_t *)&local_58);
  if ((uVar7 != 0) && (CONCAT44(uStack_54,local_58) == maxlen)) {
    puVar2 = (ushort *)((long)&local_48->proto + 0xd0);
    *puVar2 = *puVar2 | uVar7;
  }
  pbVar16 = pbVar15 + maxlen;
  lVar17 = -(lVar17 + maxlen);
LAB_0014b66d:
  pbVar15 = pbVar16;
  if (bVar18) goto LAB_0014ba85;
  goto LAB_0014b62d;
}

Assistant:

static CURLcode pop3_statemachine(struct Curl_easy *data,
                                  struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  int pop3code;
  struct pop3_conn *pop3c = &conn->proto.pop3c;
  struct pingpong *pp = &pop3c->pp;
  size_t nread = 0;
  (void)data;

  /* Busy upgrading the connection; right now all I/O is SSL/TLS, not POP3 */
  if(pop3c->state == POP3_UPGRADETLS)
    return pop3_perform_upgrade_tls(data, conn);

  /* Flush any data that needs to be sent */
  if(pp->sendleft)
    return Curl_pp_flushsend(data, pp);

 do {
    /* Read the response from the server */
   result = Curl_pp_readresp(data, FIRSTSOCKET, pp, &pop3code, &nread);
   if(result)
     return result;

    if(!pop3code)
      break;

    /* We have now received a full POP3 server response */
    switch(pop3c->state) {
    case POP3_SERVERGREET:
      result = pop3_state_servergreet_resp(data, pop3code, pop3c->state);
      break;

    case POP3_CAPA:
      result = pop3_state_capa_resp(data, pop3code, pop3c->state);
      break;

    case POP3_STARTTLS:
      result = pop3_state_starttls_resp(data, conn, pop3code, pop3c->state);
      break;

    case POP3_AUTH:
      result = pop3_state_auth_resp(data, pop3code, pop3c->state);
      break;

#ifndef CURL_DISABLE_DIGEST_AUTH
    case POP3_APOP:
      result = pop3_state_apop_resp(data, pop3code, pop3c->state);
      break;
#endif

    case POP3_USER:
      result = pop3_state_user_resp(data, pop3code, pop3c->state);
      break;

    case POP3_PASS:
      result = pop3_state_pass_resp(data, pop3code, pop3c->state);
      break;

    case POP3_COMMAND:
      result = pop3_state_command_resp(data, pop3code, pop3c->state);
      break;

    case POP3_QUIT:
      pop3_state(data, POP3_STOP);
      break;

    default:
      /* internal error */
      pop3_state(data, POP3_STOP);
      break;
    }
  } while(!result && pop3c->state != POP3_STOP && Curl_pp_moredata(pp));

  return result;
}